

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityWheel::CuriosityWheel
          (CuriosityWheel *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,CuriosityWheelType wheel_type)

{
  undefined1 auVar1 [16];
  ChQuaternion<double> local_188;
  ChVector<double> local_168;
  ChFrame<double> local_150;
  ChVector<double> local_c8;
  ChVector<double> local_b0;
  double local_98;
  double gyration2;
  double gyration1;
  double vol;
  double radius1;
  double density;
  double thickness;
  double width;
  double radius;
  shared_ptr<chrono::ChMaterialSurface> local_40;
  CuriosityWheelType local_2c;
  shared_ptr<chrono::ChMaterialSurface> *psStack_28;
  CuriosityWheelType wheel_type_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  ChFrame<double> *rel_pos_local;
  string *name_local;
  CuriosityWheel *this_local;
  
  local_2c = wheel_type;
  psStack_28 = mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)rel_pos;
  rel_pos_local = (ChFrame<double> *)name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_40,mat);
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,rel_pos,&local_40,true);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_40);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityWheel_002ee968;
  if (local_2c != RealWheel) {
    if (local_2c == SimpleWheel) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_CuriosityPart).m_mesh_name,"curiosity_simplewheel");
      goto LAB_0025908f;
    }
    if (local_2c == CylWheel) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_CuriosityPart).m_mesh_name,"curiosity_cylwheel");
      goto LAB_0025908f;
    }
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_CuriosityPart).m_mesh_name,"curiosity_wheel");
LAB_0025908f:
  ChColor::ChColor((ChColor *)&radius,1.0,1.0,1.0);
  ChColor::operator=(&(this->super_CuriosityPart).m_color,(ChColor *)&radius);
  width = 0.25;
  thickness = 0.4;
  density = 0.0008;
  radius1 = 2700.0;
  vol = 0.2492;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x3fd999999999999a),ZEXT816(0x3ff921fb54442d18),
                           ZEXT816(0x3fc921fb54442d18));
  gyration1 = auVar1._0_8_ * 0.0008;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x3fd0000000000000),ZEXT816(0x3fd0000000000000),
                           ZEXT816(0x3fafcba7b3b8a9ab));
  auVar1 = vfmadd213sd_fma(ZEXT816(0x4008000000000000),auVar1,ZEXT816(0x3fc47ae147ae147c));
  gyration2 = auVar1._0_8_ / 12.0;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x3fd0000000000000),ZEXT816(0x3fd0000000000000),
                           ZEXT816(0x3fafcba7b3b8a9ab));
  local_98 = auVar1._0_8_ * 0.5;
  (this->super_CuriosityPart).m_mass = gyration1 * 2700.0;
  ChVector<double>::ChVector(&local_c8,gyration2,local_98,gyration2);
  ChVector<double>::operator*(&local_b0,&local_c8,(this->super_CuriosityPart).m_mass);
  ChVector<double>::operator=(&(this->super_CuriosityPart).m_inertia,&local_b0);
  ChVector<double>::ChVector(&local_168,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_188,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&local_150,&local_168,&local_188);
  ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_150);
  ChFrame<double>::~ChFrame(&local_150);
  return;
}

Assistant:

CuriosityWheel::CuriosityWheel(const std::string& name,
                               const ChFrame<>& rel_pos,
                               std::shared_ptr<ChMaterialSurface> mat,
                               CuriosityWheelType wheel_type)
    : CuriosityPart(name, rel_pos, mat, true) {
    switch (wheel_type) {
        default:
        case CuriosityWheelType::RealWheel:
            m_mesh_name = "curiosity_wheel";
            break;
        case CuriosityWheelType::SimpleWheel:
            m_mesh_name = "curiosity_simplewheel";
            break;
        case CuriosityWheelType::CylWheel:
            m_mesh_name = "curiosity_cylwheel";
            break;
    }
    m_color = ChColor(1.0f, 1.0f, 1.0f);

    double radius = 0.25;       // wheel radius
    double width = 0.40;        // wheel width
    double thickness = 0.8e-3;  // average thickness
    double density = 2700;      // aluminum
    double radius1 = radius - thickness;
    double vol = (CH_C_2PI * radius * width + CH_C_PI * radius * radius) * thickness;
    double gyration1 = (3 * (radius * radius + radius1 * radius1) + width * width) / 12.0;
    double gyration2 = (radius * radius + radius1 * radius1) / 2.0;
    m_mass = density * vol;
    m_inertia = ChVector<>(gyration1, gyration2, gyration1) * m_mass;
    m_cog = ChFrame<>();
}